

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  ulong uVar7;
  byte bVar8;
  ulong extraout_RDX;
  ImGuiPopupData *pIVar9;
  ulong uVar10;
  ulong uVar11;
  ImGuiContext *g;
  bool bVar12;
  ImRect IVar13;
  
  pIVar4 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar5 = GImGui->NavWindow, pIVar5 == (ImGuiWindow *)0x0 || (pIVar5->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar6 = GImGui->HoveredRootWindow;
      if ((pIVar6 == (ImGuiWindow *)0x0) || ((pIVar6->Flags & 0x4000000) == 0)) {
        bVar12 = false;
      }
      else {
        uVar7 = (ulong)(GImGui->OpenPopupStack).Size;
        bVar12 = 0 < (long)uVar7;
        if (0 < (long)uVar7) {
          pIVar9 = (GImGui->OpenPopupStack).Data;
          bVar12 = true;
          if (pIVar9->PopupId != pIVar6->PopupId) {
            uVar10 = 1;
            do {
              uVar11 = uVar10;
              pIVar9 = pIVar9 + 1;
              if (uVar7 == uVar11) break;
              uVar10 = uVar11 + 1;
            } while (pIVar9->PopupId != pIVar6->PopupId);
            bVar12 = uVar11 < uVar7;
          }
        }
        bVar12 = (bool)(bVar12 ^ 1);
      }
      if ((pIVar6 == (ImGuiWindow *)0x0) || (bVar12)) {
        if ((pIVar5 != (ImGuiWindow *)0x0 && pIVar6 == (ImGuiWindow *)0x0) &&
           (pIVar5 = GetTopMostPopupModal(), pIVar5 == (ImGuiWindow *)0x0)) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else {
        StartMouseMovingWindow(GImGui->HoveredWindow);
        if (((pIVar4->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((pIVar6->Flags & 1) == 0))
        {
          IVar13 = ImGuiWindow::TitleBarRect(pIVar6);
          fVar1 = (pIVar4->IO).MouseClickedPos[0].x;
          if ((fVar1 < IVar13.Min.x) ||
             (((fVar2 = (pIVar4->IO).MouseClickedPos[0].y, fVar2 < IVar13.Min.y ||
               (IVar13.Max.x <= fVar1)) || (IVar13.Max.y <= fVar2)))) {
            pIVar4->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if (pIVar4->HoveredIdDisabled == true) {
          pIVar4->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
    }
    if ((pIVar4->IO).MouseClicked[1] == true) {
      pIVar6 = GetTopMostPopupModal();
      pIVar5 = pIVar4->HoveredWindow;
      if (pIVar5 != (ImGuiWindow *)0x0) {
        uVar10 = (ulong)(uint)(GImGui->Windows).Size;
        uVar7 = extraout_RDX;
        while (0 < (int)uVar10) {
          pIVar3 = (GImGui->Windows).Data[uVar10 - 1];
          bVar8 = (byte)uVar7 & pIVar3 != pIVar6 | pIVar3 == pIVar5;
          uVar7 = (ulong)bVar8;
          if ((pIVar3 == pIVar6) || (uVar10 = uVar10 - 1, pIVar3 == pIVar5)) goto LAB_001763ff;
        }
        bVar8 = 0;
LAB_001763ff:
        if (bVar8 != 0) {
          pIVar6 = pIVar5;
        }
      }
      ClosePopupsOverWindow(pIVar6,true);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}